

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_refs_pushptr(MDD *ptr)

{
  long lVar1;
  undefined8 *puVar2;
  lddmc_refs_internal_t lddmc_refs_key;
  long in_FS_OFFSET;
  
  while (lVar1 = *(long *)(in_FS_OFFSET + -0x20), lVar1 == 0) {
    lddmc_refs_init_key();
  }
  puVar2 = *(undefined8 **)(lVar1 + 0x10);
  *(undefined8 **)(lVar1 + 0x10) = puVar2 + 1;
  *puVar2 = ptr;
  lddmc_refs_key = *(lddmc_refs_internal_t *)(in_FS_OFFSET + -0x20);
  if (lddmc_refs_key->pcur != lddmc_refs_key->pend) {
    return;
  }
  lddmc_refs_ptrs_up(lddmc_refs_key);
  return;
}

Assistant:

void __attribute__((unused))
lddmc_refs_pushptr(const MDD *ptr)
{
    LOCALIZE_THREAD_LOCAL(lddmc_refs_key, lddmc_refs_internal_t);
    if (lddmc_refs_key == 0) {
        lddmc_refs_init_key();
        lddmc_refs_pushptr(ptr);
    } else {
        *lddmc_refs_key->pcur++ = ptr;
        if (lddmc_refs_key->pcur == lddmc_refs_key->pend) lddmc_refs_ptrs_up(lddmc_refs_key);
    }
}